

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_rle.c
# Opt level: O0

uint64_t internal_rle_decompress(uint8_t *out,uint64_t outsz,uint8_t *src,uint64_t packsz)

{
  size_t __n;
  ulong in_RCX;
  char *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  uint64_t count_1;
  uint64_t count;
  uint64_t outbytes;
  uint64_t unpackbytes;
  uint8_t *dst;
  int8_t *in;
  uint64_t local_48;
  ulong local_40;
  void *local_38;
  char *local_30;
  
  local_40 = 0;
  local_48 = 0;
  local_38 = in_RDI;
  local_30 = in_RDX;
  do {
    if (in_RCX <= local_40) {
      return local_48;
    }
    if (*local_30 < '\0') {
      __n = (size_t)-(int)*local_30;
      if (in_RCX < local_40 + 1 + __n) {
        return 0;
      }
      if (in_RSI < local_48 + __n) {
        return 0;
      }
      memcpy(local_38,local_30 + 1,__n);
      local_30 = local_30 + 1 + __n;
      local_40 = __n + local_40 + 1;
    }
    else {
      if (in_RCX < local_40 + 2) {
        return 0;
      }
      local_40 = local_40 + 2;
      __n = (long)*local_30 + 1;
      if (in_RSI < local_48 + __n) {
        return 0;
      }
      memset(local_38,(uint)(byte)local_30[1],__n);
      local_30 = local_30 + 2;
    }
    local_38 = (void *)(__n + (long)local_38);
    local_48 = __n + local_48;
  } while( true );
}

Assistant:

uint64_t
internal_rle_decompress (
    uint8_t* out, uint64_t outsz, const uint8_t* src, uint64_t packsz)
{
    const int8_t* in          = (const int8_t*) src;
    uint8_t*      dst         = (uint8_t*) out;
    uint64_t      unpackbytes = 0;
    uint64_t      outbytes    = 0;

    while (unpackbytes < packsz)
    {
        if (*in < 0)
        {
            uint64_t count = (uint64_t) (-((int) *in++));
            ++unpackbytes;
            if (unpackbytes + count > packsz) return 0;
            if (outbytes + count > outsz) return 0;

            memcpy (dst, in, count);
            in += count;
            dst += count;
            unpackbytes += count;
            outbytes += count;
        }
        else
        {
            uint64_t count = (uint64_t) (*in++);
            if (unpackbytes + 2 > packsz) return 0;
            unpackbytes += 2;

            ++count;
            if (outbytes + count > outsz) return 0;

            memset (dst, *(const uint8_t*) in, count);
            dst += count;
            outbytes += count;
            ++in;
        }
    }
    return outbytes;
}